

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  cmTarget *pcVar1;
  cmMakefile *pcVar2;
  Snapshot snapshot;
  auto_ptr<cmCompiledGeneratorExpression> aVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  cmLinkImplementationLibraries *pcVar8;
  pointer in_relative;
  bool debugIncludes;
  auto_ptr<cmCompiledGeneratorExpression> local_250;
  cmGeneratorExpression ge;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceIncludeDirectoriesEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  cmCommandContext local_1c0;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  Snapshot local_158;
  string libDir;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set(&uniqueIncludes);
  pcVar1 = this->Target;
  std::__cxx11::string::string((string *)&ge,"INCLUDE_DIRECTORIES",(allocator *)&cge);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,&pcVar1->Name,(string *)&ge,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&ge);
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = this->Makefile;
  std::__cxx11::string::string((string *)&ge,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator *)&cge);
  pcVar6 = cmMakefile::GetDefinition(pcVar2,(string *)&ge);
  std::__cxx11::string::~string((string *)&ge);
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::string::string((string *)&ge,pcVar6,(allocator *)&cge);
    cmSystemTools::ExpandListArgument((string *)&ge,&debugProperties,false);
    std::__cxx11::string::~string((string *)&ge);
  }
  if (this->DebugIncludesDone == false) {
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    debugIncludes =
         _Var7._M_current !=
         debugProperties.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    debugIncludes = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugIncludesDone = true;
  }
  processIncludeDirectories
            (this,&this->IncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,debugIncludes,lang);
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceIncludeDirectoriesEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&ge,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&cge);
  AddInterfaceEntries(this,config,(string *)&ge,&linkInterfaceIncludeDirectoriesEntries);
  std::__cxx11::string::~string((string *)&ge);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string((string *)&ge,"APPLE",(allocator *)&cge);
  bVar4 = cmMakefile::IsOn(pcVar2,(string *)&ge);
  std::__cxx11::string::~string((string *)&ge);
  if (bVar4) {
    pcVar8 = GetLinkImplementationLibraries(this,config);
    for (in_relative = (pcVar8->Libraries).
                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                       super__Vector_impl_data._M_start;
        in_relative !=
        (pcVar8->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
        _M_impl.super__Vector_impl_data._M_finish; in_relative = in_relative + 1) {
      cmsys::SystemTools::CollapseFullPath(&libDir,(string *)in_relative);
      if (GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
          frameworkCheck == '\0') {
        iVar5 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                     ::frameworkCheck);
        if (iVar5 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
      }
      bVar4 = cmsys::RegularExpression::find
                        (&GetIncludeDirectories::frameworkCheck,libDir._M_dataplus._M_p);
      if (bVar4) {
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)&ge,&GetIncludeDirectories::frameworkCheck,1);
        std::__cxx11::string::operator=((string *)&libDir,(string *)&ge);
        std::__cxx11::string::~string((string *)&ge);
        cmState::Snapshot::Snapshot(&local_158,(cmState *)0x0);
        local_1c0.Name._M_dataplus._M_p = (pointer)&local_1c0.Name.field_2;
        local_1c0.Name._M_string_length = 0;
        local_1c0.Name.field_2._M_local_buf[0] = '\0';
        local_1c0.Line = 0;
        snapshot.Position.Tree = local_158.Position.Tree;
        snapshot.State = local_158.State;
        snapshot.Position.Position._0_1_ = (char)local_158.Position.Position;
        snapshot.Position.Position._1_7_ = (int7)(local_158.Position.Position >> 8);
        cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge,snapshot,&local_1c0);
        cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&cge);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
        std::__cxx11::string::~string((string *)&local_1c0);
        cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_1c0,(char *)&ge);
        cge.x_ = (cmCompiledGeneratorExpression *)local_1c0.Name._M_dataplus._M_p;
        local_1c0.Name._M_dataplus._M_p = (pointer)0x0;
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_1c0);
        local_1c0.Name._M_dataplus._M_p = (pointer)operator_new(0x10);
        aVar3 = cge;
        cge.x_ = (cmCompiledGeneratorExpression *)0x0;
        local_250.x_ = (cmCompiledGeneratorExpression *)0x0;
        *(cmCompiledGeneratorExpression **)local_1c0.Name._M_dataplus._M_p = aVar3.x_;
        *(cmLinkImplItem **)(local_1c0.Name._M_dataplus._M_p + 8) =
             &TargetPropertyEntry::NoLinkImplItem;
        std::
        vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
        ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
                  ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                    *)&linkInterfaceIncludeDirectoriesEntries,(TargetPropertyEntry **)&local_1c0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_250);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
        cmGeneratorExpression::~cmGeneratorExpression(&ge);
      }
      std::__cxx11::string::~string((string *)&libDir);
    }
  }
  processIncludeDirectories
            (this,&linkInterfaceIncludeDirectoriesEntries,__return_storage_ptr__,&uniqueIncludes,
             &dagChecker,config,debugIncludes,lang);
  cmDeleteAll<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
            (&linkInterfaceIncludeDirectoriesEntries);
  std::
  _Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::~_Vector_base(&linkInterfaceIncludeDirectoriesEntries.
                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hashtable(&uniqueIncludes._M_ht);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
cmGeneratorTarget::GetIncludeDirectories(const std::string& config,
                                         const std::string& lang) const
{
  std::vector<std::string> includes;
  UNORDERED_SET<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "INCLUDE_DIRECTORIES", 0, 0);

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugIncludes = !this->DebugIncludesDone
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 "INCLUDE_DIRECTORIES")
                        != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026())
    {
    this->DebugIncludesDone = true;
    }

  processIncludeDirectories(this,
                            this->IncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            lang);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceIncludeDirectoriesEntries;
  AddInterfaceEntries(
    this, config, "INTERFACE_INCLUDE_DIRECTORIES",
    linkInterfaceIncludeDirectoriesEntries);

  if(this->Makefile->IsOn("APPLE"))
    {
    cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibraries(config);
    for(std::vector<cmLinkImplItem>::const_iterator
        it = impl->Libraries.begin();
        it != impl->Libraries.end(); ++it)
      {
      std::string libDir = cmSystemTools::CollapseFullPath(*it);

      static cmsys::RegularExpression
        frameworkCheck("(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
      if(!frameworkCheck.find(libDir))
        {
        continue;
        }

      libDir = frameworkCheck.match(1);

      cmGeneratorExpression ge;
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                ge.Parse(libDir.c_str());
      linkInterfaceIncludeDirectoriesEntries
              .push_back(new cmGeneratorTarget::TargetPropertyEntry(cge));
      }
    }

  processIncludeDirectories(this,
                            linkInterfaceIncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            lang);

  cmDeleteAll(linkInterfaceIncludeDirectoriesEntries);

  return includes;
}